

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

NodePtr __thiscall avro::resolveSymbol(avro *this,NodePtr *node)

{
  undefined8 *puVar1;
  shared_count extraout_RDX;
  NodePtr NVar2;
  shared_ptr<avro::NodeSymbolic> symNode;
  element_type *local_40;
  shared_count local_38;
  undefined1 local_30 [16];
  
  local_40 = node->px;
  if (local_40->type_ == AVRO_NUM_TYPES) {
    local_38.pi_ = (node->pn).pi_;
    if (local_38.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
      UNLOCK();
    }
    NodeSymbolic::getNode((NodeSymbolic *)this);
    boost::detail::shared_count::~shared_count(&local_38);
    NVar2.pn.pi_ = extraout_RDX.pi_;
    NVar2.px = (element_type *)this;
    return NVar2;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40 = (element_type *)local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Only symbolic nodes may be resolved","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)&local_40);
  *puVar1 = 0x1cc910;
  puVar1[1] = 0x1cc940;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline NodePtr resolveSymbol(const NodePtr &node) 
{
    if(node->type() != AVRO_SYMBOLIC) {
        throw Exception("Only symbolic nodes may be resolved");
    }
    boost::shared_ptr<NodeSymbolic> symNode = boost::static_pointer_cast<NodeSymbolic>(node);
    return symNode->getNode();
}